

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O3

int generate_by_miniscript_pk_k
              (miniscript_node_t *node,miniscript_node_t *parent,int32_t derive_child_num,
              uchar *script,size_t script_len,size_t *write_len)

{
  int iVar1;
  
  iVar1 = -2;
  if ((0x41 < script_len && node->child != (miniscript_node_t *)0x0) &&
     ((parent == (miniscript_node_t *)0x0 || (parent->info != (miniscript_item_t *)0x0)))) {
    iVar1 = generate_script_from_miniscript
                      (node->child,node,derive_child_num,script + 1,script_len - 1,write_len);
    if (iVar1 == 0) {
      iVar1 = -2;
      if (0xfffffffffffffdf6 < *write_len - 0x208) {
        *script = (uchar)*write_len;
        *write_len = *write_len + 1;
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

static int generate_by_miniscript_pk_k(
    struct miniscript_node_t *node,
    struct miniscript_node_t *parent,
    int32_t derive_child_num,
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    int ret;

    if (!node->child || (script_len < EC_PUBLIC_KEY_LEN * 2) || (parent && !parent->info))
        return WALLY_EINVAL;

    ret = generate_script_from_miniscript(node->child, node, derive_child_num, &script[1], script_len - 1, write_len);
    if (ret != WALLY_OK)
        return ret;

    if (*write_len + 1 > DESCRIPTOR_REDEEM_SCRIPT_MAX_SIZE)
        return WALLY_EINVAL;

    script[0] = (unsigned char)*write_len;
    ++(*write_len);
    return ret;
}